

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall ON_COMPONENT_INDEX::IsSubDComponentIndex(ON_COMPONENT_INDEX *this)

{
  bool local_11;
  bool rc;
  ON_COMPONENT_INDEX *this_local;
  
  local_11 = false;
  if (((this->m_type - subd_vertex < 3) && (this->m_index != -1)) && (this->m_index != 0)) {
    local_11 = true;
  }
  return local_11;
}

Assistant:

bool ON_COMPONENT_INDEX::IsSubDComponentIndex() const
{
  bool rc = false;
  switch(m_type)
  {
  case ON_COMPONENT_INDEX::subd_vertex:
  case ON_COMPONENT_INDEX::subd_edge:
  case ON_COMPONENT_INDEX::subd_face:
    if ( -1 != m_index && 0 != m_index )
    {
      rc = true;
    }
    break;
  default:
    // intentionally skipping other ON_COMPONENT_INDEX::TYPE enum values
    break;
  }
  return rc;
}